

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::Write_IO(GB *this,u8 addr,u8 val)

{
  u8 *puVar1;
  byte old_tac;
  byte bVar2;
  byte bVar3;
  u16 new_div;
  bool bVar4;
  div_t dVar5;
  uchar *puVar6;
  uchar *puVar7;
  u8 uVar8;
  bool enabled;
  u16 cur_div;
  u16 old_div;
  u8 mask;
  u8 old;
  u8 *byte;
  u8 val_local;
  u8 addr_local;
  GB *this_local;
  
  puVar1 = (this->s).io + addr;
  old_tac = *puVar1;
  bVar2 = Write_IO::dmg_io_mask[addr];
  bVar3 = *puVar1;
  *puVar1 = (val ^ bVar3) & bVar2 ^ bVar3;
  if (addr - 4 < 0x4d) {
    switch((uint)addr) {
    case 4:
      dVar5 = div(this,(uint)bVar2,(uint)bVar3);
      (this->s).div_reset_tick = (this->s).tick;
      (this->s).io[4] = '\0';
      CheckDiv(this,(u16)dVar5.quot,0,(this->s).io[7],(this->s).io[7]);
      break;
    case 5:
      if ((this->s).tick - (this->s).tima_overflow_tick == 10) {
        *puVar1 = old_tac;
      }
      break;
    case 6:
      if ((this->s).tick - (this->s).tima_overflow_tick == 10) {
        (this->s).io[5] = *puVar1;
      }
      break;
    case 7:
      if ((old_tac & 4) == 0) {
        dVar5 = div(this,(uint)bVar2,(uint)bVar3);
        new_div = (u16)dVar5.quot;
        if ((*puVar1 & 4) != 0) {
          new_div = 0;
        }
        CheckDiv(this,(u16)dVar5.quot,new_div,old_tac,*puVar1);
      }
      break;
    case 0x40:
      if (((old_tac ^ *puVar1) & 0x80) != 0) {
        bVar4 = (*puVar1 & 0x80) != 0;
        if (bVar4) {
          (this->s).ppu_lcd_on_tick = (this->s).tick + 1;
          (this->s).ppu_line_start_tick = (this->s).ppu_lcd_on_tick + -8;
          (this->s).ppu_mode_start_tick = (this->s).ppu_lcd_on_tick + -4;
          (this->s).ppu_line_y = '\0';
          (this->s).ppu_line_x = '\0';
          (this->s).ppu_pixel = (this->s).ppu_buffer;
        }
        else {
          (this->s).ppu_lcd_on_tick = 0x7fffffffffffffff;
        }
        uVar8 = '\0';
        if (bVar4) {
          uVar8 = '\x02';
        }
        (this->s).ppu_mode = uVar8;
        (this->s).io[0x44] = '\0';
        (this->s).io[0x41] = (this->s).io[0x41] & 0xfc;
      }
      break;
    case 0x42:
      break;
    case 0x43:
      break;
    case 0x46:
      (this->s).dma_start_tick = (this->s).tick + 8;
      (this->s).dma_addr = (ushort)val << 8;
      break;
    case 0x4a:
      break;
    case 0x4b:
      break;
    case 0x50:
      bVar4 = has_boot_rom(this);
      if (((bVar4) &&
          (puVar7 = (this->s).rom0p,
          puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->boot_rom)
          , puVar7 == puVar6)) && (val == '\x01')) {
        puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->rom);
        (this->s).rom0p = puVar7;
        (this->s).io[0x11] = 0xbf;
        (this->s).io[0x13] = 0xff;
        (this->s).io[0x26] = 0xf1;
      }
    }
  }
  return;
}

Assistant:

void GB::Write_IO(u8 addr, u8 val) {
  static const u8 dmg_io_mask[256] = {
      0x30, 0xff, 0x81, 0,    0,    0xff, 0xff, 0x07, 0,    0,    0,    0,
      0,    0,    0,    0x1f, 0x7f, 0xff, 0xff, 0xff, 0x40, 0,    0xff, 0xff,
      0xff, 0x40, 0x80, 0xff, 0x60, 0xff, 0x40, 0,    0,    0xff, 0xff, 0x40,
      0xff, 0xff, 0x80, 0,    0,    0,    0,    0,    0,    0,    0,    0,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0x78, 0xff, 0xff, 0,    0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0,    0,    0,    0,    0,    0,    0,    0,
      0,    0,    0,    0,    0,    0,    0,    0,    0,    0,    0,    0,
      0,    0,    0,    0,    0,    0,    0,    0,    0,    0,    0,    0,
      0,    0,    0,    0,    0,    0,    0,    0,    0,    0,    0,    0,
      0,    0,    0,    0,    0,    0,    0,    0,    0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff};

  u8& byte = s.io[addr];
  u8 old = byte;
  u8 mask = dmg_io_mask[addr];
  byte = (byte & ~mask) | (val & mask);

  switch (addr) {
    case DIV: {
      DPRINT(TIMER, "wrote div\n");
      u16 old_div = div();
      s.div_reset_tick = s.tick;
      s.io[DIV] = 0;
      if (CheckDiv(old_div, 0, s.io[TAC], s.io[TAC])) {
      DPRINT(TIMER, "++tima from div write\n");
      }
      break;
    }
    case TIMA:
      DPRINT(TIMER, "wrote tima=%02x->%02x\n", old, byte);
      // TODO(binji): gotta be a simpler solution here...
      if (s.tick - s.tima_overflow_tick == TIMER_RESET_DELAY) {
        DPRINT(TIMER, "  overriden by TIMA reset =>%02x\n", old);
        byte = old;
      }
      break;
    case TMA:
      DPRINT(TIMER, "wrote tma=%02x->%02x\n", old, byte);
      // TODO(binji): gotta be a simpler solution here...
      if (s.tick - s.tima_overflow_tick == TIMER_RESET_DELAY) {
        DPRINT(TIMER, "  copied to TIMA\n");
        s.io[TIMA] = byte;
      }
      break;
    case TAC:
      DPRINT(TIMER, "wrote tac=%02x->%02x enable=%d clock=%d\n", old, byte,
            (byte & 4) >> 2, byte & 3);
      if (!(old & 4)) {
        u16 cur_div = div();
        if (CheckDiv(cur_div, (byte & 4) ? 0 : cur_div, old, byte)) {
          DPRINT(TIMER, "++tima from tac write\n");
        }
      }
      break;
    case LCDC:
      if ((old ^ byte) & 0x80) {
        bool enabled = !!(byte & 0x80);
        if (enabled) {
          s.ppu_lcd_on_tick = s.tick + 1;
          s.ppu_line_start_tick = s.ppu_lcd_on_tick - LINE_START_TICK;
          s.ppu_mode_start_tick = s.ppu_lcd_on_tick - MODE_START_TICK;
          s.ppu_line_x = s.ppu_line_y = 0;
          s.ppu_pixel = s.ppu_buffer;
          DPRINT(MODE, "(%ld) lcd on\n", s.tick - s.ppu_lcd_on_tick);
        } else {
          s.ppu_lcd_on_tick = MaxTick;
        }
        s.ppu_mode = enabled ? 2 : 0;
        s.io[LY] = 0;
        s.io[STAT] &= ~3;
      }
      break;
    case DMA:
      s.dma_start_tick = s.tick + DMA_DELAY;
      s.dma_addr = val << 8;
      DPRINT(DMA, "dma triggered, active=%.f\n", clocks(s.dma_start_tick));
      break;

    case WX:
      DPRINT(WINDOW, "wx: %d ly: %d\n", s.io[WX], s.io[LY]);
      break;

    case WY:
      DPRINT(WINDOW, "wy: %d ly: %d\n", s.io[WY], s.io[LY]);
      break;

    case SCX:
      DPRINT(SCROLL, "scx: %d ly: %d\n", s.io[SCX], s.io[LY]);
      break;

    case SCY:
      DPRINT(SCROLL, "scy: %d ly: %d\n", s.io[SCY], s.io[LY]);
      break;

    case BOOT:
      if (has_boot_rom() && s.rom0p == boot_rom.data() && val == 1) {
        s.rom0p = rom.data();
        // TODO: remove cheat for APU regs
        s.io[NR11] = 0xbf;
        s.io[NR13] = 0xff;
        s.io[NR52] = 0xf1;
      }
      break;
  }
}